

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_Constractor4_Test::TestBody(ConfidentialTxOut_Constractor4_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertHelper local_418;
  Message local_410;
  int local_404;
  int64_t local_400;
  undefined1 local_3f8;
  Amount local_3f0;
  int64_t local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_6;
  Message local_3c0;
  ByteData local_3b8;
  string local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_5;
  Message local_368;
  ByteData local_360;
  string local_348;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_4;
  Message local_310;
  ConfidentialNonce local_308;
  string local_2e0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_3;
  Message local_2a8;
  Script local_2a0;
  string local_268;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  Message local_230;
  int64_t local_228;
  int64_t local_220;
  undefined1 local_218;
  ConfidentialValue local_210;
  Amount local_1e8;
  int64_t local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  Message local_1b8;
  string local_1b0;
  ConfidentialAssetId local_180;
  string local_158;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  undefined1 local_20 [8];
  Amount amount;
  ConfidentialTxOut_Constractor4_Test *this_local;
  
  amount._8_8_ = this;
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_20 = (undefined1  [8])AVar3.amount_;
  amount.amount_._0_1_ = AVar3.ignore_check_;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&gtest_ar.message_,&exp_asset,(Amount *)local_20);
  cfd::core::ConfidentialTxOut::GetAsset(&local_180,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_158,&local_180);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1b0,&exp_asset);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_138,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_158);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  cfd::core::ConfidentialTxOut::GetConfidentialValue
            (&local_210,(ConfidentialTxOut *)&gtest_ar.message_);
  AVar3 = cfd::core::ConfidentialValue::GetAmount(&local_210);
  local_220 = AVar3.amount_;
  local_218 = AVar3.ignore_check_;
  local_1e8.amount_ = local_220;
  local_1e8.ignore_check_ = (bool)local_218;
  local_1d8 = cfd::core::Amount::GetSatoshiValue(&local_1e8);
  local_228 = cfd::core::Amount::GetSatoshiValue((Amount *)local_20);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_1d0,
             "txout.GetConfidentialValue().GetAmount().GetSatoshiValue()","amount.GetSatoshiValue()"
             ,&local_1d8,&local_228);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  cfd::core::AbstractTxOut::GetLockingScript(&local_2a0,(AbstractTxOut *)&gtest_ar.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_268,&local_2a0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_248,"txout.GetLockingScript().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_268);
  cfd::core::Script::~Script(&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  cfd::core::ConfidentialTxOut::GetNonce(&local_308,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_2e0,&local_308);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2c0,"txout.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_2e0);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_308);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  cfd::core::ConfidentialTxOut::GetRangeProof(&local_360,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_348,&local_360);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_328,"txout.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_348);
  cfd::core::ByteData::~ByteData(&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  cfd::core::ConfidentialTxOut::GetSurjectionProof
            (&local_3b8,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3a0,&local_3b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_380,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_3a0);
  cfd::core::ByteData::~ByteData(&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  AVar3 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&gtest_ar.message_);
  local_400 = AVar3.amount_;
  local_3f8 = AVar3.ignore_check_;
  local_3f0.amount_ = local_400;
  local_3f0.ignore_check_ = (bool)local_3f8;
  local_3e0 = cfd::core::Amount::GetSatoshiValue(&local_3f0);
  local_404 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_3d8,"txout.GetValue().GetSatoshiValue()","0",&local_3e0,
             &local_404);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor4) {
  // ConfidentialAssetId, ConfidentialValue
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}